

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

ON__UINT32 * __thiscall
ON_DimStyle::Internal_GetOverrideParentBit(ON_DimStyle *this,field field_id,ON__UINT32 *mask)

{
  ON_DimStyle *local_38;
  ON__UINT32 *bits;
  uint i;
  uint bitdex;
  ON__UINT32 *mask_local;
  field field_id_local;
  ON_DimStyle *this_local;
  
  bits._4_4_ = 0;
  if (field_id < Count) {
    bits._0_4_ = field_id;
    if (field_id < ExtensionLineExtension) {
      this_local = (ON_DimStyle *)0x0;
    }
    else {
      for (; TextColorSource < (field)bits && bits._4_4_ < 4;
          bits._0_4_ = (field)bits - ExtLineColor) {
        bits._4_4_ = bits._4_4_ + 1;
      }
      *mask = 1 << ((byte)(field)bits & 0x1f);
      if (bits._4_4_ == 0) {
        local_38 = (ON_DimStyle *)&this->m_field_override_parent_bits0;
      }
      else if (bits._4_4_ == 1) {
        local_38 = (ON_DimStyle *)&this->m_field_override_parent_bits1;
      }
      else if (bits._4_4_ == 2) {
        local_38 = (ON_DimStyle *)&this->m_field_override_parent_bits2;
      }
      else if (bits._4_4_ == 3) {
        local_38 = (ON_DimStyle *)&this->m_field_override_parent_bits3;
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
                   ,0x146d,"",
                   "field_id too big - add another m_independent_of_parent_bitsN = 0 member.");
        local_38 = (ON_DimStyle *)0x0;
        *mask = 0;
      }
      this_local = local_38;
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x144d,"","Invalid field_id value.");
    this_local = (ON_DimStyle *)0x0;
  }
  return (ON__UINT32 *)this_local;
}

Assistant:

ON__UINT32* ON_DimStyle::Internal_GetOverrideParentBit(ON_DimStyle::field field_id, ON__UINT32* mask) const
{
  unsigned int bitdex = 0;
  unsigned int i = static_cast<unsigned int>(field_id);
  if (i >= static_cast<unsigned int>(ON_DimStyle::field::Count))
  {
    ON_ERROR("Invalid field_id value.");
    return nullptr;
  }

  if (i <= static_cast<unsigned int>(ON_DimStyle::field::Index))
  {
    // query makes no sense for Unset, Name and Index
    // because these cannot be inherited from parent.
    // false is returned instead of the more accurate true
    // because that's the way this code has worked for years
    // and being accurate would cause bugs at this point.
    return nullptr; 
  }

  while (i >= 32 && bitdex < 4)
  {
    bitdex++;
    i -= 32;
  }
  *mask = (1 << i);

  const ON__UINT32* bits;
  if (0 == bitdex)
    bits = &m_field_override_parent_bits0;
  else if (1 == bitdex)
    bits = &m_field_override_parent_bits1;
  else if (2 == bitdex)
    bits = &m_field_override_parent_bits2;
  else if (3 == bitdex)
    bits = &m_field_override_parent_bits3;
  else
  {
    ON_ERROR("field_id too big - add another m_independent_of_parent_bitsN = 0 member.");
    bits = nullptr;
    *mask = 0;
  }

  return const_cast<ON__UINT32*>(bits);
}